

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.cpp
# Opt level: O2

bool __thiscall
FSChaCha20Poly1305::Decrypt
          (FSChaCha20Poly1305 *this,Span<const_std::byte> cipher,Span<const_std::byte> aad,
          Span<std::byte> plain1,Span<std::byte> plain2)

{
  long lVar1;
  Nonce96 nonce;
  bool bVar2;
  long in_FS_OFFSET;
  undefined4 uStack_24;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nonce._4_4_ = uStack_24;
  nonce.first = this->m_packet_counter;
  nonce.second = this->m_rekey_counter;
  bVar2 = AEADChaCha20Poly1305::Decrypt(&this->m_aead,cipher,aad,nonce,plain1,plain2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    NextPacket(this);
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool FSChaCha20Poly1305::Decrypt(Span<const std::byte> cipher, Span<const std::byte> aad, Span<std::byte> plain1, Span<std::byte> plain2) noexcept
{
    bool ret = m_aead.Decrypt(cipher, aad, {m_packet_counter, m_rekey_counter}, plain1, plain2);
    NextPacket();
    return ret;
}